

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

void __thiscall FloatInstance::FloatInstance(FloatInstance *this,string *value)

{
  bool bVar1;
  undefined8 *puVar2;
  char *__nptr;
  string *in_RDI;
  double dVar3;
  Instance *this_00;
  undefined1 local_31 [41];
  string *str;
  
  this_00 = (Instance *)local_31;
  str = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_31 + 1),"Float",(allocator *)this_00);
  Instance::Instance(this_00,in_RDI);
  std::__cxx11::string::~string((string *)(local_31 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_31);
  *(undefined ***)in_RDI = &PTR__FloatInstance_0020edc0;
  bVar1 = Grammar::is_float_value(str);
  if (!bVar1) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = "RuntimeError: invalid argument.";
    __cxa_throw(puVar2,&char_const*::typeinfo,0);
  }
  __nptr = (char *)std::__cxx11::string::c_str();
  dVar3 = atof(__nptr);
  *(float *)(in_RDI + 0x58) = (float)dVar3;
  return;
}

Assistant:

FloatInstance::FloatInstance(const std::string& value) : Instance("Float") {
    if (!Grammar::is_float_value(value))
        throw EXC_INVALID_ARGUMENT;
    _value = atof(value.c_str());
}